

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::ParseFromArray
          (ChromeProcessDescriptor *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  uint8_t cur_byte_2;
  ChromeProcessDescriptor_ProcessType CVar9;
  ulong uVar10;
  uint8_t cur_byte;
  ulong uVar11;
  uint8_t cur_byte_1;
  ulong *puVar12;
  Field local_58;
  ChromeProcessDescriptor *local_48;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    if (puVar7 <= raw) goto switchD_002431f2_caseD_3;
    bVar1 = (byte)*raw;
    uVar6 = (ulong)bVar1;
    puVar8 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar6 = (ulong)(bVar1 & 0x7f);
      lVar4 = 7;
      do {
        if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_002431f2_caseD_3;
        uVar3 = *puVar8;
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
        lVar4 = lVar4 + 7;
      } while ((char)(byte)uVar3 < '\0');
    }
    uVar3 = uVar6 >> 3;
    if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_002431f2_caseD_3;
    switch((uint)uVar6 & 7) {
    case 0:
      uVar5 = 0;
      uVar10 = 0;
      while( true ) {
        puVar12 = (ulong *)((long)puVar8 + 1);
        uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar5;
        if (-1 < (char)(byte)*puVar8) break;
        if ((puVar7 <= puVar12) ||
           (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar8 = puVar12, bVar2))
        goto switchD_002431f2_caseD_3;
      }
      uVar10 = uVar5 & 0xffffffff00000000;
      break;
    case 1:
      puVar12 = puVar8 + 1;
      if (puVar7 < puVar12) goto switchD_002431f2_caseD_3;
      uVar5 = *puVar8;
      uVar10 = uVar5 & 0xffffffff00000000;
      break;
    case 2:
      puVar8 = (ulong *)((long)puVar8 + 1);
      uVar11 = 0;
      uVar5 = 0;
      puVar12 = puVar8;
      while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) | uVar11
            , (char)*(byte *)((long)puVar12 + -1) < '\0') {
        if (puVar7 <= puVar12) goto switchD_002431f2_caseD_3;
        puVar12 = (ulong *)((long)puVar12 + 1);
        puVar8 = (ulong *)((long)puVar8 + 1);
        bVar2 = 0x38 < uVar5;
        uVar5 = uVar5 + 7;
        if (bVar2) goto switchD_002431f2_caseD_3;
      }
      if (uVar11 <= (ulong)((long)puVar7 - (long)puVar8)) {
        uVar10 = (ulong)puVar8 & 0xffffffff00000000;
        puVar12 = (ulong *)((long)puVar12 + uVar11);
        uVar5 = (ulong)puVar8 & 0xffffffff;
        goto LAB_002432cf;
      }
    default:
      goto switchD_002431f2_caseD_3;
    case 5:
      puVar12 = (ulong *)((long)puVar8 + 4);
      if (puVar7 < puVar12) goto switchD_002431f2_caseD_3;
      uVar5 = (ulong)(uint)*puVar8;
      uVar10 = 0;
    }
    uVar11 = 0;
LAB_002432cf:
    raw = puVar12;
  } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar11));
  local_58.int_value_ = uVar10 | uVar5 & 0xffffffff;
  uVar5 = uVar3 << 0x20 | uVar11;
  local_58.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
  local_58.size_ = (uint32_t)uVar11;
  local_58.id_ = (uint16_t)(uVar5 >> 0x20);
  if ((short)uVar3 != 0) {
    local_40 = &this->host_app_package_name_;
    local_48 = this;
    do {
      if ((ushort)uVar3 < 6) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar3 & 0x3f);
      }
      CVar9 = (ChromeProcessDescriptor_ProcessType)local_58.int_value_;
      switch((uint)uVar3 & 0xffff) {
      case 1:
        this->process_type_ = CVar9;
        break;
      case 2:
        this->process_priority_ = CVar9;
        break;
      case 3:
        this->legacy_sort_index_ = CVar9;
        break;
      case 4:
        protozero::Field::get(&local_58,local_40);
        this = local_48;
        break;
      case 5:
        this->crash_trace_id_ = local_58.int_value_;
        break;
      default:
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_38);
        this = local_48;
      }
      do {
        if (puVar7 <= raw) goto switchD_002431f2_caseD_3;
        bVar1 = (byte)*raw;
        uVar6 = (ulong)(uint)bVar1;
        puVar8 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar6 = (ulong)(bVar1 & 0x7f);
          lVar4 = 7;
          do {
            if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_002431f2_caseD_3;
            uVar3 = *puVar8;
            puVar8 = (ulong *)((long)puVar8 + 1);
            uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
            lVar4 = lVar4 + 7;
          } while ((char)(byte)uVar3 < '\0');
        }
        uVar3 = uVar6 >> 3;
        if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_002431f2_caseD_3;
        switch((uint)uVar6 & 7) {
        case 0:
          uVar5 = 0;
          uVar10 = 0;
          while( true ) {
            puVar12 = (ulong *)((long)puVar8 + 1);
            uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar5;
            if (-1 < (char)(byte)*puVar8) break;
            if ((puVar7 <= puVar12) ||
               (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar8 = puVar12, bVar2))
            goto switchD_002431f2_caseD_3;
          }
          uVar10 = uVar5 & 0xffffffff00000000;
          break;
        case 1:
          puVar12 = puVar8 + 1;
          if (puVar7 < puVar12) goto switchD_002431f2_caseD_3;
          uVar5 = *puVar8;
          uVar10 = uVar5 & 0xffffffff00000000;
          break;
        case 2:
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar11 = 0;
          uVar5 = 0;
          puVar12 = puVar8;
          while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) |
                          uVar11, (char)*(byte *)((long)puVar12 + -1) < '\0') {
            if (puVar7 <= puVar12) goto switchD_002431f2_caseD_3;
            puVar12 = (ulong *)((long)puVar12 + 1);
            puVar8 = (ulong *)((long)puVar8 + 1);
            bVar2 = 0x38 < uVar5;
            uVar5 = uVar5 + 7;
            if (bVar2) goto switchD_002431f2_caseD_3;
          }
          if (uVar11 <= (ulong)((long)puVar7 - (long)puVar8)) {
            uVar10 = (ulong)puVar8 & 0xffffffff00000000;
            puVar12 = (ulong *)((long)puVar12 + uVar11);
            uVar5 = (ulong)puVar8 & 0xffffffff;
            goto LAB_002435d1;
          }
        default:
          goto switchD_002431f2_caseD_3;
        case 5:
          puVar12 = (ulong *)((long)puVar8 + 4);
          if (puVar7 < puVar12) goto switchD_002431f2_caseD_3;
          uVar5 = (ulong)(uint)*puVar8;
          uVar10 = 0;
        }
        uVar11 = 0;
LAB_002435d1:
        raw = puVar12;
      } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar11));
      local_58.int_value_ = uVar10 | uVar5 & 0xffffffff;
      uVar5 = uVar3 << 0x20 | uVar11;
      local_58.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
      local_58.size_ = (uint32_t)uVar11;
      local_58.id_ = (uint16_t)(uVar5 >> 0x20);
    } while ((short)uVar3 != 0);
  }
switchD_002431f2_caseD_3:
  return puVar7 == (ulong *)raw;
}

Assistant:

bool ChromeProcessDescriptor::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_type */:
        field.get(&process_type_);
        break;
      case 2 /* process_priority */:
        field.get(&process_priority_);
        break;
      case 3 /* legacy_sort_index */:
        field.get(&legacy_sort_index_);
        break;
      case 4 /* host_app_package_name */:
        field.get(&host_app_package_name_);
        break;
      case 5 /* crash_trace_id */:
        field.get(&crash_trace_id_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}